

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomBuilder.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  size_type sVar1;
  pointer ppCVar2;
  int iVar3;
  uint uVar4;
  LatticeFactory *this;
  SimInfo *pSVar5;
  MoLocator *this_00;
  Molecule *mol;
  DumpWriter *this_01;
  size_t __i;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  double dVar11;
  undefined8 uVar12;
  vector<double,_std::allocator<double>_> molFractions;
  vector<int,_std::allocator<int>_> nMol;
  int remaining;
  vector<int,_std::allocator<int>_> ids;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> sites;
  vector<double,_std::allocator<double>_> molecularMasses;
  vector<double,_std::allocator<double>_> lc;
  RealType latticeConstant;
  string outputFileName;
  string latticeType;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> orientations;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> latticePos;
  string inputFileName;
  vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_> components;
  SimCreator newCreator;
  SimCreator oldCreator;
  Mat3x3d hmat;
  gengetopt_args_info args_info;
  random_device rd;
  mt19937 gen;
  vector<double,_std::allocator<double>_> local_2ac8;
  uint local_2aa4;
  int local_2aa0;
  int local_2a9c;
  vector<int,_std::allocator<int>_> local_2a98;
  double local_2a80;
  int local_2a74;
  ulong local_2a70;
  SimInfo *local_2a68;
  undefined8 uStack_2a60;
  _func_int **local_2a58;
  Lattice *local_2a50;
  pointer local_2a48;
  ulong local_2a40;
  vector<int,_std::allocator<int>_> local_2a38;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_2a18;
  vector<double,_std::allocator<double>_> local_29f8;
  int local_29dc;
  void *local_29d8;
  iterator iStack_29d0;
  double *local_29c8;
  SimInfo *local_29b8;
  double local_29b0;
  string local_29a8;
  string local_2988;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_2968;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_2948;
  string local_2930;
  vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_> local_2910;
  pointer local_28f8;
  SimCreator local_28f0;
  vector<int,_std::allocator<int>_> local_28c8;
  SimCreator local_28b0;
  Mat3x3d local_2888;
  gengetopt_args_info local_2840;
  anon_union_5000_2_650ea050_for_random_device_0 local_2748;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  OpenMD::registerLattice();
  local_2988._M_dataplus._M_p = (pointer)&local_2988.field_2;
  local_2988._M_string_length = 0;
  local_2988.field_2._M_local_buf[0] = '\0';
  local_2930._M_dataplus._M_p = (pointer)&local_2930.field_2;
  local_2930._M_string_length = 0;
  local_2930.field_2._M_local_buf[0] = '\0';
  local_29a8._M_dataplus._M_p = (pointer)&local_29a8.field_2;
  local_29a8._M_string_length = 0;
  local_29a8.field_2._M_local_buf[0] = '\0';
  local_29c8 = (double *)0x0;
  local_29d8 = (void *)0x0;
  iStack_29d0._M_current = (double *)0x0;
  local_2888.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
  local_2888.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
  local_2888.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
  local_2888.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
  local_2888.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
  local_2888.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
  local_2888.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
  local_2888.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
  local_2888.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
  local_2948.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2948.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2948.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar3 = cmdline_parser(argc,argv,&local_2840);
  if (iVar3 != 0) {
    exit(1);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_2988,0,(char *)local_2988._M_string_length,0x293090);
  sVar1 = local_2988._M_string_length;
  if (local_2840.lattice_given != 0) {
    strlen(local_2840.lattice_arg);
    std::__cxx11::string::_M_replace
              ((ulong)&local_2988,0,(char *)sVar1,(ulong)local_2840.lattice_arg);
  }
  this = OpenMD::LatticeFactory::getInstance();
  local_2a50 = OpenMD::LatticeFactory::createLattice(this,&local_2988);
  if (local_2a50 == (Lattice *)0x0) {
    snprintf(painCave.errMsg,2000,"Lattice Factory can not create %s lattice\n",
             local_2988._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  local_2a40 = (ulong)(uint)local_2a50->nCellSites;
  local_2aa4 = local_2840.nx_arg;
  if (local_2840.nx_arg < 1) {
    memcpy(&painCave,"The number of unit cells in the x direction must be greater than 0.",0x44);
    painCave.isFatal = 1;
    simError();
  }
  local_2aa0 = local_2840.ny_arg;
  if (local_2840.ny_arg < 1) {
    memcpy(&painCave,"The number of unit cells in the y direction must be greater than 0.",0x44);
    painCave.isFatal = 1;
    simError();
  }
  local_2a9c = local_2840.nz_arg;
  if (local_2840.nz_arg < 1) {
    memcpy(&painCave,"The number of unit cells in the z direction must be greater than 0.",0x44);
    painCave.isFatal = 1;
    simError();
  }
  sVar1 = local_2930._M_string_length;
  if (local_2840.inputs_num == 0) {
    builtin_strncpy(painCave.errMsg + 0x30,"mand line",10);
    builtin_strncpy(painCave.errMsg + 0x20,"ified on the com",0x10);
    builtin_strncpy(painCave.errMsg + 0x10,"le name was spec",0x10);
    builtin_strncpy(painCave.errMsg,"No input .omd fi",0x10);
    painCave.isFatal = 1;
    simError();
  }
  else {
    __s = *local_2840.inputs;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_2930,0,(char *)sVar1,(ulong)__s);
  }
  local_28b0.mdFileName_._M_dataplus._M_p = (pointer)&local_28b0.mdFileName_.field_2;
  local_2a58 = (_func_int **)&PTR__SimCreator_002fdfc8;
  local_28b0._vptr_SimCreator = (_func_int **)&PTR__SimCreator_002fdfc8;
  local_28b0.mdFileName_._M_string_length = 0;
  local_28b0.mdFileName_.field_2._M_local_buf[0] = '\0';
  pSVar5 = OpenMD::SimCreator::createSim(&local_28b0,&local_2930,false);
  std::vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>::vector
            (&local_2910,&pSVar5->simParams_->components_);
  ppCVar2 = local_2910.super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_29f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_29f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_29f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_2a98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_2a98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_2a98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_2a48 = local_2910.
               super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>._M_impl
               .super__Vector_impl_data._M_finish;
  uVar7 = (long)local_2910.
                super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_2910.
                super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  local_29b8 = pSVar5;
  if ((long)local_2910.super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_2910.super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>
            ._M_impl.super__Vector_impl_data._M_start == 8) {
    local_2748._M_mt._M_x[0] = 0x3ff0000000000000;
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&local_2ac8,(iterator)0x0,(double *)&local_2748);
  }
  else if (uVar7 == local_2840.molFraction_given) {
    if (local_2910.super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_2910.super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      lVar8 = uVar7 + (uVar7 == 0);
      lVar10 = 0;
      do {
        if (local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_2ac8,
                     (iterator)
                     local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                     (double *)((long)local_2840.molFraction_arg + lVar10));
        }
        else {
          *local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish =
               *(double *)((long)local_2840.molFraction_arg + lVar10);
          local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        lVar10 = lVar10 + 8;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
  }
  else {
    uVar6 = uVar7 - 1;
    if (uVar6 == local_2840.molFraction_given) {
      local_2748._M_mt._M_x[0] = 0x3ff0000000000000;
      if (uVar6 != 0) {
        lVar8 = 0;
        do {
          if (local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      ((vector<double,std::allocator<double>> *)&local_2ac8,
                       (iterator)
                       local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish,
                       (double *)((long)local_2840.molFraction_arg + lVar8));
          }
          else {
            *local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish =
                 *(double *)((long)local_2840.molFraction_arg + lVar8);
            local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_2748.field_0._M_file =
               (void *)((double)local_2748.field_0._M_file -
                       *(double *)
                        ((long)local_2ac8.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar8));
          lVar8 = lVar8 + 8;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
      if (local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&local_2ac8,
                   (iterator)
                   local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,(double *)&local_2748);
      }
      else {
        *local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = (double)local_2748.field_0._M_file;
        local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
    }
    else {
      memcpy(&painCave,
             "randomBuilder can\'t figure out molFractions for all of the components in the <MetaData> block."
             ,0x5f);
      painCave.isFatal = 1;
      simError();
    }
  }
  local_2a70 = uVar7;
  if (local_2a48 == ppCVar2) {
    dVar11 = -1.0;
  }
  else {
    uVar6 = 0;
    dVar11 = 0.0;
    uVar12 = 0;
    do {
      if ((ulong)((long)local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) <= uVar6) {
LAB_0012ac4b:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar6
                  );
      }
      local_2a68 = (SimInfo *)dVar11;
      uStack_2a60 = uVar12;
      if (local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar6] <= 0.0 &&
          local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar6] != 0.0) {
        builtin_strncpy(painCave.errMsg,"One of the requested molFractions was less than zero!",0x36
                       );
        painCave.isFatal = 1;
        simError();
      }
      if ((ulong)((long)local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) <= uVar6) goto LAB_0012ac4b;
      if (1.0 < local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6]) {
        builtin_strncpy(painCave.errMsg,"One of the requested molFractions was greater than one!",
                        0x38);
        painCave.isFatal = 1;
        simError();
      }
      if ((ulong)((long)local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) <= uVar6) goto LAB_0012ac4b;
      dVar11 = (double)local_2a68 +
               local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar6];
      uVar6 = uVar6 + 1;
      uVar12 = uStack_2a60;
    } while (uVar7 + (uVar7 == 0) != uVar6);
    dVar11 = dVar11 + -1.0;
  }
  uVar7 = local_2a70;
  if (1e-06 < ABS(dVar11)) {
    builtin_strncpy(painCave.errMsg,"The sum of molFractions was not close enough to 1.0",0x34);
    painCave.isFatal = 1;
    simError();
  }
  iVar3 = (int)local_2a40 * local_2a9c * local_2aa4 * local_2aa0;
  local_2a68 = (SimInfo *)(double)iVar3;
  local_2a74 = iVar3;
  if (uVar7 != 1) {
    uVar6 = 0;
    do {
      if ((ulong)((long)local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) <= uVar6) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar6
                  );
      }
      local_2748._M_mt._M_x[0]._0_4_ =
           (int)(local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar6] * (double)local_2a68);
      if (local_2a98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_2a98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_2a98,
                   (iterator)
                   local_2a98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_2748);
      }
      else {
        *local_2a98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = (int)(local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar6] * (double)local_2a68);
        local_2a98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_2a98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      if ((ulong)((long)local_2a98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_2a98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) <= uVar6) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar6
                  );
      }
      local_2a74 = local_2a74 -
                   local_2a98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar7 - 1 != uVar6);
  }
  local_29dc = iVar3;
  if (local_2a98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_2a98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_2a98,
               (iterator)
               local_2a98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_2a74);
  }
  else {
    *local_2a98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = local_2a74;
    local_2a98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2a98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_28f8 = ppCVar2;
  if (local_2a48 == ppCVar2) {
    dVar11 = 0.0;
    iVar3 = 0;
  }
  else {
    uVar6 = local_2a70 + (local_2a70 == 0);
    lVar8 = 0;
    dVar11 = 0.0;
    uVar7 = 0;
    iVar3 = 0;
    do {
      if ((ulong)((long)local_2a98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_2a98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) <= uVar7) {
LAB_0012ac5c:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7
                  );
      }
      iVar9 = local_2a98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7];
      local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start[uVar7] = (double)iVar9 / (double)local_2a68;
      local_2a80 = dVar11;
      local_2748.field_0._M_file =
           (void *)OpenMD::MoLocator::getMolMass
                             (*(MoleculeStamp **)
                               ((long)(local_29b8->moleculeStamps_).
                                      super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start + (lVar8 >> 0x1d)),
                              local_29b8->forceField_);
      if (local_29f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_29f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_29f8,
                   (iterator)
                   local_29f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,(double *)&local_2748);
      }
      else {
        *local_29f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = (double)local_2748.field_0._M_file;
        local_29f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_29f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      if (((ulong)((long)local_2a98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_2a98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2) <= uVar7) ||
         ((ulong)((long)local_29f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_29f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) <= uVar7)) goto LAB_0012ac5c;
      iVar3 = iVar3 + iVar9;
      dVar11 = local_2a80 +
               (double)local_2a98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar7] *
               local_29f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar7];
      uVar7 = uVar7 + 1;
      lVar8 = lVar8 + 0x100000000;
    } while (uVar6 != uVar7);
  }
  if (iVar3 != local_29dc) {
    local_2a80 = dVar11;
    memcpy(&painCave,
           "Computed total number of molecules is not equal to the number of lattice sites!",0x50);
    painCave.isFatal = 1;
    simError();
    dVar11 = local_2a80;
  }
  local_29b0 = pow(((double)(int)local_2a40 * 1.661 * (dVar11 / (double)iVar3)) /
                   local_2840.density_arg,0.3333333333333333);
  if (iStack_29d0._M_current == local_29c8) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)&local_29d8,iStack_29d0,&local_29b0);
  }
  else {
    *iStack_29d0._M_current = local_29b0;
    iStack_29d0._M_current = iStack_29d0._M_current + 1;
  }
  (*local_2a50->_vptr_Lattice[3])(local_2a50,&local_29d8);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
             &local_2748.field_0,&local_2a50->cellSitesOrt);
  uVar12 = local_2748.field_0._M_file;
  local_2a18.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a18.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a18.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a80 = 0.0;
  local_2968.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2968.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2968.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (0 < (int)local_2aa4) {
    lVar8 = local_2a40 * 0x18;
    do {
      if (0 < local_2aa0) {
        local_2a68 = (SimInfo *)((ulong)local_2a68 & 0xffffffff00000000);
        do {
          if (0 < local_2a9c) {
            iVar3 = 0;
            do {
              OpenMD::Lattice::getLatticePointsPos
                        (local_2a50,&local_2948,SUB84(local_2a80,0),(int)local_2a68,iVar3);
              if (0 < (int)local_2a40) {
                lVar10 = 0;
                do {
                  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
                  push_back(&local_2a18,
                            (value_type *)
                            ((long)((local_2948.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super_Vector<double,_3U>).data_ + lVar10));
                  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
                  push_back(&local_2968,(value_type *)(uVar12 + lVar10));
                  lVar10 = lVar10 + 0x18;
                } while (lVar8 != lVar10);
              }
              iVar3 = iVar3 + 1;
            } while (iVar3 != local_2a9c);
          }
          iVar3 = (int)local_2a68 + 1;
          local_2a68 = (SimInfo *)CONCAT44(local_2a68._4_4_,iVar3);
        } while (iVar3 != local_2aa0);
      }
      uVar4 = SUB84(local_2a80,0) + 1;
      local_2a80 = (double)(ulong)uVar4;
    } while (uVar4 != local_2aa4);
  }
  sVar1 = local_29a8._M_string_length;
  strlen(local_2840.output_arg);
  std::__cxx11::string::_M_replace((ulong)&local_29a8,0,(char *)sVar1,(ulong)local_2840.output_arg);
  std::vector<int,_std::allocator<int>_>::vector(&local_28c8,&local_2a98);
  createMdFile(&local_2930,&local_29a8,&local_28c8);
  if (local_28c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_28c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  (*local_29b8->_vptr_SimInfo[1])();
  local_28f0.mdFileName_._M_dataplus._M_p = (pointer)&local_28f0.mdFileName_.field_2;
  local_28f0._vptr_SimCreator = local_2a58;
  local_28f0.mdFileName_._M_string_length = 0;
  local_28f0.mdFileName_.field_2._M_local_buf[0] = '\0';
  pSVar5 = OpenMD::SimCreator::createSim(&local_28f0,&local_29a8,false);
  local_2888.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
       (double)(int)local_2aa4 * local_29b0;
  local_2888.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] =
       (double)local_2aa0 * local_29b0;
  local_2888.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
  local_2888.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
  local_2888.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
  local_2888.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] =
       (double)local_2a9c * local_29b0;
  local_2888.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
  local_2888.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
  local_2888.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
  OpenMD::Snapshot::setHmat(pSVar5->sman_->currentSnapshot_,&local_2888);
  local_2a38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (int *)0x0;
  local_2a38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_2a38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  if (local_2a18.
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl
      .super__Vector_impl_data._M_finish !=
      local_2a18.
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl
      .super__Vector_impl_data._M_start) {
    uVar7 = 0;
    do {
      local_2748._M_mt._M_x[0]._0_4_ = (int)uVar7;
      if (local_2a38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_2a38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_2a38,
                   (iterator)
                   local_2a38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_2748);
      }
      else {
        *local_2a38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = (int)uVar7;
        local_2a38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_2a38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)(((long)local_2a18.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_2a18.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555));
  }
  std::random_device::random_device((random_device *)&local_2748.field_0);
  uVar4 = std::random_device::_M_getval();
  ppCVar2 = local_28f8;
  local_13b8._M_x[0] = (unsigned_long)uVar4;
  lVar8 = 1;
  uVar7 = local_13b8._M_x[0];
  do {
    uVar7 = (ulong)(((uint)(uVar7 >> 0x1e) ^ (uint)uVar7) * 0x6c078965 + (int)lVar8);
    local_13b8._M_x[lVar8] = uVar7;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x270);
  local_13b8._M_p = 0x270;
  std::
  shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_2a38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_2a38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_13b8);
  if (local_2a48 != ppCVar2) {
    local_2a70 = local_2a70 + (local_2a70 == 0);
    uVar7 = 0;
    lVar8 = 0;
    local_2a68 = pSVar5;
    do {
      pSVar5 = local_2a68;
      this_00 = (MoLocator *)operator_new(0x30);
      OpenMD::MoLocator::MoLocator
                (this_00,(pSVar5->moleculeStamps_).
                         super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[(int)uVar7],pSVar5->forceField_);
      if ((ulong)((long)local_2a98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_2a98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) <= uVar7) {
LAB_0012ac3a:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7
                  );
      }
      iVar3 = (int)lVar8;
      lVar8 = (long)iVar3;
      iVar9 = 0;
      while (iVar9 < local_2a98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar7]) {
        mol = OpenMD::SimInfo::getMoleculeByGlobalIndex(local_2a68,iVar9 + iVar3);
        OpenMD::MoLocator::placeMol
                  (this_00,local_2a18.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                           local_2a38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar8],
                   local_2968.
                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start +
                   local_2a38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar8],mol);
        lVar8 = lVar8 + 1;
        iVar9 = iVar9 + 1;
        if ((ulong)((long)local_2a98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_2a98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) <= uVar7) goto LAB_0012ac3a;
      }
      uVar7 = uVar7 + 1;
      pSVar5 = local_2a68;
    } while (uVar7 != local_2a70);
  }
  this_01 = (DumpWriter *)operator_new(0x60);
  OpenMD::DumpWriter::DumpWriter(this_01,pSVar5,&local_29a8);
  OpenMD::DumpWriter::writeDump(this_01);
  OpenMD::DumpWriter::~DumpWriter(this_01);
  operator_delete(this_01,0x60);
  snprintf(painCave.errMsg,2000,"A new OpenMD file called \"%s\" has been generated.\n",
           local_29a8._M_dataplus._M_p);
  painCave.isFatal = 0;
  painCave.severity = 3;
  simError();
  std::random_device::_M_fini();
  if (local_2a38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_2a38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2a38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_28f0._vptr_SimCreator = local_2a58;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28f0.mdFileName_._M_dataplus._M_p != &local_28f0.mdFileName_.field_2) {
    operator_delete(local_28f0.mdFileName_._M_dataplus._M_p,
                    CONCAT71(local_28f0.mdFileName_.field_2._M_allocated_capacity._1_7_,
                             local_28f0.mdFileName_.field_2._M_local_buf[0]) + 1);
  }
  if (local_2968.
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2968.
                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2968.
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2968.
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2a18.
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a18.
                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2a18.
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a18.
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2a98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2a98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2a98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_29f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_29f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_29f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_29f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2910.super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2910.
                    super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2910.
                          super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2910.
                          super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_28b0._vptr_SimCreator = local_2a58;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28b0.mdFileName_._M_dataplus._M_p != &local_28b0.mdFileName_.field_2) {
    operator_delete(local_28b0.mdFileName_._M_dataplus._M_p,
                    CONCAT71(local_28b0.mdFileName_.field_2._M_allocated_capacity._1_7_,
                             local_28b0.mdFileName_.field_2._M_local_buf[0]) + 1);
  }
  if ((void *)uVar12 != (void *)0x0) {
    operator_delete((void *)uVar12,local_2748._M_mt._M_x[2] - uVar12);
  }
  if (local_2948.
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2948.
                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2948.
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2948.
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_29d8 != (void *)0x0) {
    operator_delete(local_29d8,(long)local_29c8 - (long)local_29d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_29a8._M_dataplus._M_p != &local_29a8.field_2) {
    operator_delete(local_29a8._M_dataplus._M_p,
                    CONCAT71(local_29a8.field_2._M_allocated_capacity._1_7_,
                             local_29a8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2930._M_dataplus._M_p != &local_2930.field_2) {
    operator_delete(local_2930._M_dataplus._M_p,
                    CONCAT71(local_2930.field_2._M_allocated_capacity._1_7_,
                             local_2930.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2988._M_dataplus._M_p != &local_2988.field_2) {
    operator_delete(local_2988._M_dataplus._M_p,
                    CONCAT71(local_2988.field_2._M_allocated_capacity._1_7_,
                             local_2988.field_2._M_local_buf[0]) + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  registerLattice();

  gengetopt_args_info args_info;
  std::string latticeType;
  std::string inputFileName;
  std::string outputFileName;
  Lattice* simpleLat;
  RealType latticeConstant;
  std::vector<RealType> lc;
  const RealType rhoConvertConst = 1.661;
  RealType density;
  int nx, ny, nz;
  Mat3x3d hmat;
  MoLocator* locator;
  std::vector<Vector3d> latticePos;
  std::vector<Vector3d> latticeOrt;
  int nMolPerCell;
  DumpWriter* writer;

  // parse command line arguments
  if (cmdline_parser(argc, argv, &args_info) != 0) exit(1);

  density = args_info.density_arg;

  // get lattice type
  latticeType = "FCC";
  if (args_info.lattice_given) { latticeType = args_info.lattice_arg; }

  simpleLat = LatticeFactory::getInstance().createLattice(latticeType);

  if (simpleLat == NULL) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "Lattice Factory can not create %s lattice\n",
             latticeType.c_str());
    painCave.isFatal = 1;
    simError();
  }
  nMolPerCell = simpleLat->getNumSitesPerCell();

  // get the number of unit cells in each direction:

  nx = args_info.nx_arg;

  if (nx <= 0) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "The number of unit cells in the x direction "
             "must be greater than 0.");
    painCave.isFatal = 1;
    simError();
  }

  ny = args_info.ny_arg;

  if (ny <= 0) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "The number of unit cells in the y direction "
             "must be greater than 0.");
    painCave.isFatal = 1;
    simError();
  }

  nz = args_info.nz_arg;

  if (nz <= 0) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "The number of unit cells in the z direction "
             "must be greater than 0.");
    painCave.isFatal = 1;
    simError();
  }

  int nSites = nMolPerCell * nx * ny * nz;

  // get input file name
  if (args_info.inputs_num)
    inputFileName = args_info.inputs[0];
  else {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "No input .omd file name was specified "
             "on the command line");
    painCave.isFatal = 1;
    simError();
  }

  // parse md file and set up the system

  SimCreator oldCreator;
  SimInfo* oldInfo   = oldCreator.createSim(inputFileName, false);
  Globals* simParams = oldInfo->getSimParams();

  // Calculate lattice constant (in Angstroms)

  std::vector<Component*> components = simParams->getComponents();
  std::vector<RealType> molFractions;
  std::vector<RealType> molecularMasses;
  std::vector<int> nMol;
  std::size_t nComponents = components.size();

  if (nComponents == 1) {
    molFractions.push_back(1.0);
  } else {
    if (args_info.molFraction_given == nComponents) {
      for (std::size_t i = 0; i < nComponents; i++) {
        molFractions.push_back(args_info.molFraction_arg[i]);
      }
    } else if (args_info.molFraction_given == nComponents - 1) {
      RealType remainingFraction = 1.0;
      for (std::size_t i = 0; i < nComponents - 1; i++) {
        molFractions.push_back(args_info.molFraction_arg[i]);
        remainingFraction -= molFractions[i];
      }
      molFractions.push_back(remainingFraction);
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "randomBuilder can't figure out molFractions "
               "for all of the components in the <MetaData> block.");
      painCave.isFatal = 1;
      simError();
    }
  }

  // do some sanity checking:

  RealType totalFraction = 0.0;

  for (std::size_t i = 0; i < nComponents; i++) {
    if (molFractions.at(i) < 0.0) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "One of the requested molFractions was"
               " less than zero!");
      painCave.isFatal = 1;
      simError();
    }
    if (molFractions.at(i) > 1.0) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "One of the requested molFractions was"
               " greater than one!");
      painCave.isFatal = 1;
      simError();
    }
    totalFraction += molFractions.at(i);
  }
  if (abs(totalFraction - 1.0) > 1e-6) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "The sum of molFractions was not close enough to 1.0");
    painCave.isFatal = 1;
    simError();
  }

  int remaining = nSites;
  for (std::size_t i = 0; i < nComponents - 1; i++) {
    nMol.push_back(int((RealType)nSites * molFractions.at(i)));
    remaining -= nMol.at(i);
  }
  nMol.push_back(remaining);

  // recompute actual mol fractions and perform final sanity check:

  int totalMolecules = 0;
  RealType totalMass = 0.0;
  for (std::size_t i = 0; i < nComponents; i++) {
    molFractions[i] = (RealType)(nMol.at(i)) / (RealType)nSites;
    totalMolecules += nMol.at(i);
    molecularMasses.push_back(MoLocator::getMolMass(
        oldInfo->getMoleculeStamp(i), oldInfo->getForceField()));
    totalMass += (RealType)(nMol.at(i)) * molecularMasses.at(i);
  }
  RealType avgMass = totalMass / (RealType)totalMolecules;

  if (totalMolecules != nSites) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "Computed total number of molecules is not equal "
             "to the number of lattice sites!");
    painCave.isFatal = 1;
    simError();
  }

  latticeConstant = pow(rhoConvertConst * nMolPerCell * avgMass / density,
                        (RealType)(1.0 / 3.0));

  // Set the lattice constant

  lc.push_back(latticeConstant);
  simpleLat->setLatticeConstant(lc);

  // Calculate the lattice sites and fill the lattice vector.

  // Get the standard orientations of the cell sites

  latticeOrt = simpleLat->getLatticePointsOrt();

  vector<Vector3d> sites;
  vector<Vector3d> orientations;

  for (int i = 0; i < nx; i++) {
    for (int j = 0; j < ny; j++) {
      for (int k = 0; k < nz; k++) {
        // Get the position of the cell sites

        simpleLat->getLatticePointsPos(latticePos, i, j, k);

        for (int l = 0; l < nMolPerCell; l++) {
          sites.push_back(latticePos[l]);
          orientations.push_back(latticeOrt[l]);
        }
      }
    }
  }

  outputFileName = args_info.output_arg;

  // create a new .omd file on the fly which corrects the number of molecules

  createMdFile(inputFileName, outputFileName, nMol);

  delete oldInfo;

  // We need to read in the new SimInfo object, then Parse the
  // md file and set up the system

  SimCreator newCreator;
  SimInfo* newInfo = newCreator.createSim(outputFileName, false);

  // fill Hmat

  hmat(0, 0) = nx * latticeConstant;
  hmat(0, 1) = 0.0;
  hmat(0, 2) = 0.0;

  hmat(1, 0) = 0.0;
  hmat(1, 1) = ny * latticeConstant;
  hmat(1, 2) = 0.0;

  hmat(2, 0) = 0.0;
  hmat(2, 1) = 0.0;
  hmat(2, 2) = nz * latticeConstant;

  // Set Hmat

  newInfo->getSnapshotManager()->getCurrentSnapshot()->setHmat(hmat);

  // place the molecules

  // Randomize a vector of ints:

  vector<int> ids;
  for (std::size_t i = 0; i < sites.size(); i++)
    ids.push_back(i);

  /* Set up the random number generator engine */
  std::random_device rd;   // Non-deterministic, uniformly-distributed integer
                           // random number generator
  std::mt19937 gen(rd());  // 32-bit Mersenne Twister random number engine

  std::shuffle(ids.begin(), ids.end(), gen);

  Molecule* mol;
  int l = 0;
  for (std::size_t i = 0; i < nComponents; i++) {
    locator =
        new MoLocator(newInfo->getMoleculeStamp(i), newInfo->getForceField());
    for (int n = 0; n < nMol.at(i); n++) {
      mol = newInfo->getMoleculeByGlobalIndex(l);
      locator->placeMol(sites[ids[l]], orientations[ids[l]], mol);
      l++;
    }
  }

  // Create DumpWriter and write out the coordinates

  writer = new DumpWriter(newInfo, outputFileName);

  if (writer == NULL) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "error in creating DumpWriter");
    painCave.isFatal = 1;
    simError();
  }

  writer->writeDump();

  // deleting the writer will put the closing at the end of the dump file.

  delete writer;

  snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
           "A new OpenMD file called \"%s\" has been "
           "generated.\n",
           outputFileName.c_str());
  painCave.isFatal  = 0;
  painCave.severity = OPENMD_INFO;
  simError();
  return 0;
}